

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O3

void ENUMS_EQUAL_INTWithUnscopedEnumTestMethod_(void)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  char *pcVar3;
  char *pcVar4;
  SimpleString SStack_38;
  SimpleString local_28;
  
  pUVar1 = UtestShell::getCurrent();
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,0,0,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x4fb,pTVar2);
  pUVar1 = UtestShell::getCurrent();
  StringFrom((int)&local_28);
  pcVar3 = SimpleString::asCharString(&local_28);
  StringFrom((int)&SStack_38);
  pcVar4 = SimpleString::asCharString(&SStack_38);
  pTVar2 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x16])
            (pUVar1,1,pcVar3,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x4fc,pTVar2);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

static void ENUMS_EQUAL_INTWithUnscopedEnumTestMethod_()
{
    ENUMS_EQUAL_INT(UNSCOPED_ENUM_B, UNSCOPED_ENUM_B);
    ENUMS_EQUAL_INT(UNSCOPED_ENUM_B, UNSCOPED_ENUM_A);
}